

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_dr_flac_ogg__read_page_header
                    (ma_dr_flac_read_proc onRead,void *pUserData,ma_dr_flac_ogg_page_header *pHeader
                    ,ma_uint32 *pBytesRead,ma_uint32 *pCRC32)

{
  long lVar1;
  int *in_RCX;
  ma_uint32 *in_RDX;
  ma_uint32 *in_RSI;
  ma_dr_flac_ogg_page_header *in_RDI;
  undefined4 *in_R8;
  bool bVar2;
  ma_result result;
  ma_uint8 id [4];
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined4 *local_38;
  int *local_30;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  ma_result mVar3;
  
  *in_RCX = 0;
  local_38 = in_R8;
  local_30 = in_RCX;
  lVar1 = (*(code *)in_RDI)(in_RSI,&local_3c,4);
  if (lVar1 == 4) {
    *local_30 = *local_30 + 4;
    do {
      while( true ) {
        bVar2 = false;
        if (((local_3c == (_func_size_t_void_ptr_void_ptr_size_t)0x4f) &&
            (bVar2 = false, local_3b == (_func_size_t_void_ptr_void_ptr_size_t)0x67)) &&
           (bVar2 = false, local_3a == (_func_size_t_void_ptr_void_ptr_size_t)0x67)) {
          bVar2 = local_39 == (_func_size_t_void_ptr_void_ptr_size_t)0x53;
        }
        if (bVar2) break;
        local_3c = local_3b;
        local_3b = local_3a;
        local_3a = local_39;
        lVar1 = (*(code *)in_RDI)(in_RSI,&local_39,1);
        if (lVar1 != 1) {
          return MA_AT_END;
        }
        *local_30 = *local_30 + 1;
      }
      *local_38 = 0x5fb0a94f;
      mVar3 = ma_dr_flac_ogg__read_page_header_after_capture_pattern
                        ((ma_dr_flac_read_proc)&local_3c,
                         (void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                         in_RDI,in_RSI,in_RDX);
      if (mVar3 == MA_SUCCESS) {
        return MA_SUCCESS;
      }
    } while (mVar3 == MA_CRC_MISMATCH);
  }
  else {
    mVar3 = MA_AT_END;
  }
  return mVar3;
}

Assistant:

static ma_result ma_dr_flac_ogg__read_page_header(ma_dr_flac_read_proc onRead, void* pUserData, ma_dr_flac_ogg_page_header* pHeader, ma_uint32* pBytesRead, ma_uint32* pCRC32)
{
    ma_uint8 id[4];
    *pBytesRead = 0;
    if (onRead(pUserData, id, 4) != 4) {
        return MA_AT_END;
    }
    *pBytesRead += 4;
    for (;;) {
        if (ma_dr_flac_ogg__is_capture_pattern(id)) {
            ma_result result;
            *pCRC32 = MA_DR_FLAC_OGG_CAPTURE_PATTERN_CRC32;
            result = ma_dr_flac_ogg__read_page_header_after_capture_pattern(onRead, pUserData, pHeader, pBytesRead, pCRC32);
            if (result == MA_SUCCESS) {
                return MA_SUCCESS;
            } else {
                if (result == MA_CRC_MISMATCH) {
                    continue;
                } else {
                    return result;
                }
            }
        } else {
            id[0] = id[1];
            id[1] = id[2];
            id[2] = id[3];
            if (onRead(pUserData, &id[3], 1) != 1) {
                return MA_AT_END;
            }
            *pBytesRead += 1;
        }
    }
}